

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t pbrt::Hash<pbrt::Point3<float>,pbrt::Point3<float>>
                   (Point3<float> args,Point3<float> args_1)

{
  undefined8 uVar1;
  Point3<float> args_00;
  Point3<float> v;
  uint64_t uVar2;
  undefined1 in_ZMM0 [64];
  float in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  uint64_t buf [3];
  size_t n;
  size_t sz;
  undefined4 in_stack_ffffffffffffff74;
  uchar local_68 [16];
  undefined8 in_stack_ffffffffffffffa8;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  vmovlpd_avx(in_ZMM2._0_16_);
  v.super_Tuple3<pbrt::Point3,_float>.z = 4.2039e-45;
  v.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_ffffffffffffffa8;
  args_00.super_Tuple3<pbrt::Point3,_float>.z = in_XMM1_Da;
  args_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  args_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  hashRecursiveCopy<pbrt::Point3<float>,pbrt::Point3<float>>
            ((char *)CONCAT44(in_stack_ffffffffffffff74,in_XMM1_Da),v,args_00);
  uVar2 = MurmurHash64A(local_68,0x18,0);
  return uVar2;
}

Assistant:

PBRT_CPU_GPU inline uint64_t Hash(Args... args) {
    // C++, you never cease to amaze: https://stackoverflow.com/a/57246704
    constexpr size_t sz = (sizeof(Args) + ... + 0);
    constexpr size_t n = (sz + 7) / 8;
    uint64_t buf[n];
    hashRecursiveCopy((char *)buf, args...);
    return MurmurHash64A((const unsigned char *)buf, sz, 0);
}